

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O1

void __thiscall pg::PTLSolver::run(PTLSolver *this)

{
  bitset *this_00;
  Game *pGVar1;
  uint64_t *puVar2;
  pointer ppiVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  ostream *poVar15;
  long lVar16;
  int **x;
  pointer ppiVar17;
  pointer *ppiVar18;
  
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  pGVar1 = (this->super_Solver).game;
  uVar12 = pGVar1->n_vertices;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar12;
  uVar8 = SUB168(auVar7 * ZEXT816(0x18),0);
  uVar9 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0x18),8) == 0) {
    uVar8 = uVar9;
  }
  puVar10 = (ulong *)operator_new__(uVar8);
  *puVar10 = uVar12;
  if (uVar12 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar12 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  piVar11 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  this->str = piVar11;
  bitset::resize(&this->H,pGVar1->n_vertices);
  bitset::resize(&this->S0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->S1,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  uVar12 = (this->G)._bitssize;
  if (uVar12 != 0) {
    puVar2 = this_00->_bits;
    uVar8 = 0;
    do {
      puVar2[uVar8] = ~puVar2[uVar8];
      uVar8 = uVar8 + 1;
      uVar12 = (this->G)._bitssize;
    } while (uVar8 < uVar12);
  }
  uVar8 = (this->G)._size & 0x3f;
  if (uVar8 != 0) {
    this_00->_bits[uVar12 - 1] = this_00->_bits[uVar12 - 1] & ~(-1L << uVar8);
  }
  puVar13 = (this->Q).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->Q).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->Q).queue = puVar13;
  puVar13 = (this->SolvedQ0).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->SolvedQ0).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->SolvedQ0).queue = puVar13;
  puVar13 = (this->SolvedQ1).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->SolvedQ1).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->SolvedQ1).queue = puVar13;
  puVar13 = (this->Zvec).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->Zvec).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->Zvec).queue = puVar13;
  puVar13 = (this->tangleto).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->tangleto).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar13;
  bitset::resize(&this->bs_exits,((this->super_Solver).game)->n_vertices);
  puVar13 = (this->pea_vS).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->pea_vS).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_vS).queue = puVar13;
  puVar13 = (this->pea_iS).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->pea_iS).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_iS).queue = puVar13;
  puVar13 = (this->pea_S).queue;
  uVar12 = ((this->super_Solver).game)->n_vertices;
  (this->pea_S).pointer = 0;
  if (puVar13 != (uint *)0x0) {
    operator_delete__(puVar13);
  }
  puVar13 = (uint *)operator_new__((uVar12 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar13;
  pGVar1 = (this->super_Solver).game;
  uVar12 = pGVar1->n_vertices;
  uVar8 = 0xffffffffffffffff;
  if (uVar12 < 0x4000000000000000) {
    uVar8 = uVar12 * 4;
  }
  puVar14 = (uint *)operator_new__(uVar8);
  this->pea_vidx = puVar14;
  bitset::resize(&this->pea_root,pGVar1->n_vertices);
  solve(this);
  poVar15 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"found ",6);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->dominions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," dominions.",0xb);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  poVar15 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"solved with ",0xc);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->tangles);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," tangles and ",0xd);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," iterations.",0xc);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  uVar12 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar12) {
    uVar8 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,"search was incomplete!");
        std::endl<char,std::char_traits<char>>(poVar15);
        exit(-1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
  }
  ppiVar3 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar17 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar17 != ppiVar3; ppiVar17 = ppiVar17 + 1) {
    if (*ppiVar17 != (int *)0x0) {
      operator_delete__(*ppiVar17);
    }
  }
  ppiVar3 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar17 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar17 != ppiVar3; ppiVar17 = ppiVar17 + 1) {
    if (*ppiVar17 != (int *)0x0) {
      operator_delete__(*ppiVar17);
    }
  }
  pvVar4 = this->tin;
  if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar18 = &pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar5 != (pointer)0x0) {
      lVar16 = (long)piVar5 * 0x18;
      do {
        pvVar6 = *(void **)((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar16);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)ppiVar18 + lVar16) - (long)pvVar6);
        }
        lVar16 = lVar16 + -0x18;
      } while (lVar16 != 0);
    }
    operator_delete__(ppiVar18,(long)piVar5 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx != (uint *)0x0) {
    operator_delete__(this->pea_vidx);
    return;
  }
  return;
}

Assistant:

void
PTLSolver::run()
{
    iterations = 0;
    dominions = 0;
    tangles = 0;

    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    H.resize(nodecount());
    S0.resize(nodecount());
    S1.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());
    SolvedQ0.resize(nodecount());
    SolvedQ1.resize(nodecount());
    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    bs_exits.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    solve();

    logger << "found " << dominions << " dominions." << std::endl;
    logger << "solved with " << tangles << " tangles and " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    // delete[] tangles
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}